

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

unique_ptr<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>_>
pbrt::PathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  _Head_base<0UL,_pbrt::PathIntegrator_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  allocator<char> local_a6;
  allocator<char> local_a5;
  Float local_a4;
  Float rrThreshold;
  int maxDepth;
  string lightStrategy;
  string local_78;
  _Head_base<0UL,_pbrt::PathIntegrator_*,_false> local_58;
  bool regularize;
  
  local_58._M_head_impl = (PathIntegrator *)parameters;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lightStrategy,"maxdepth",(allocator<char> *)&local_78);
  iVar3 = ParameterDictionary::GetOneInt((ParameterDictionary *)camera,&lightStrategy,5);
  std::__cxx11::string::~string((string *)&lightStrategy);
  maxDepth = iVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lightStrategy,"rrthreshold",(allocator<char> *)&local_78);
  local_a4 = ParameterDictionary::GetOneFloat((ParameterDictionary *)camera,&lightStrategy,1.0);
  std::__cxx11::string::~string((string *)&lightStrategy);
  rrThreshold = local_a4;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"lightsampler",&local_a6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&regularize,"bvh",&local_a5);
  ParameterDictionary::GetOneString
            (&lightStrategy,(ParameterDictionary *)camera,&local_78,(string *)&regularize);
  std::__cxx11::string::~string((string *)&regularize);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"regularize",&local_a6);
  bVar2 = ParameterDictionary::GetOneBool((ParameterDictionary *)camera,&local_78,false);
  std::__cxx11::string::~string((string *)&local_78);
  _Var1._M_head_impl = local_58._M_head_impl;
  regularize = bVar2;
  std::
  make_unique<pbrt::PathIntegrator,int&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,float&,std::__cxx11::string&,bool&>
            ((int *)local_58._M_head_impl,(CameraHandle *)&maxDepth,sampler,aggregate,lights,
             (float *)loc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rrThreshold,
             (bool *)&lightStrategy);
  std::__cxx11::string::~string((string *)&lightStrategy);
  return (__uniq_ptr_data<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>,_true,_true>
          )(__uniq_ptr_data<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>,_true,_true>
            )_Var1._M_head_impl;
}

Assistant:

std::unique_ptr<PathIntegrator> PathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    Float rrThreshold = parameters.GetOneFloat("rrthreshold", 1.);
    std::string lightStrategy = parameters.GetOneString("lightsampler", "bvh");
    bool regularize = parameters.GetOneBool("regularize", false);
    return std::make_unique<PathIntegrator>(maxDepth, camera, sampler, aggregate, lights,
                                            rrThreshold, lightStrategy, regularize);
}